

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcModule.c
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  uint8_t *puVar1;
  
  if ((*(uint *)(ctx + 4) & 0xfffffff1) != 0) {
    return 5;
  }
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  X86_init(MRI);
  *(code **)(ctx + 8) = X86_Intel_printInst;
  *(undefined4 *)(ctx + 0x6c) = 1;
  *(MCRegisterInfo **)(ctx + 0x10) = MRI;
  *(code **)(ctx + 0x18) = X86_getInstruction;
  *(code **)(ctx + 0x30) = X86_reg_name;
  *(code **)(ctx + 0x48) = X86_get_insn_id;
  *(code **)(ctx + 0x38) = X86_insn_name;
  *(code **)(ctx + 0x40) = X86_group_name;
  *(undefined8 *)(ctx + 0x50) = 0;
  if (*(int *)(ctx + 4) == 8) {
    puVar1 = regsize_map_64;
  }
  else {
    puVar1 = regsize_map_32;
  }
  *(uint8_t **)(ctx + 0xa8) = puVar1;
  return 0;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_BIG_ENDIAN | CS_MODE_V9))
		return CS_ERR_MODE;

	mri = cs_mem_malloc(sizeof(*mri));

	Sparc_init(mri);
	ud->printer = Sparc_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = Sparc_getInstruction;
	ud->post_printer = Sparc_post_printer;

	ud->reg_name = Sparc_reg_name;
	ud->insn_id = Sparc_get_insn_id;
	ud->insn_name = Sparc_insn_name;
	ud->group_name = Sparc_group_name;

	return CS_ERR_OK;
}